

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void vkt::ssbo::anon_unknown_15::generateCompareSrc
               (ostream *src,char *resultVar,BufferLayout *bufferLayout,BufferBlock *block,
               int instanceNdx,BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath,
               MatrixLoadFlags matrixLoadFlag)

{
  byte bVar1;
  long lVar2;
  void *typeName_00;
  DataType basicType_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  StructType *this;
  BufferVar *pBVar6;
  TypeComponentVector *pTVar7;
  void *valuePtr_00;
  ostream *poVar8;
  undefined4 in_register_00000084;
  int local_15c;
  string local_158;
  void *local_138;
  void *valuePtr;
  char *typeName;
  undefined1 local_120 [3];
  bool isMatrix;
  DataType basicType;
  string shaderName;
  BufferVarLayoutEntry *varLayout;
  undefined1 local_f0 [4];
  int varNdx;
  string apiName;
  int local_9c;
  int memberNdx;
  int numMembers;
  SubTypeAccess local_88;
  int local_58;
  int local_54;
  int elemNdx;
  int arraySize;
  VarType curType;
  BlockDataPtr *blockPtr_local;
  int instanceNdx_local;
  BufferBlock *block_local;
  BufferLayout *bufferLayout_local;
  char *resultVar_local;
  ostream *src_local;
  
  pTVar7 = (TypeComponentVector *)CONCAT44(in_register_00000084,instanceNdx);
  curType.m_data._8_8_ = blockPtr;
  glu::SubTypeAccess::getType((VarType *)&elemNdx,accessPath);
  bVar4 = glu::VarType::isArrayType((VarType *)&elemNdx);
  if (bVar4) {
    iVar5 = glu::VarType::getArraySize((VarType *)&elemNdx);
    if (iVar5 == -1) {
      local_15c = BufferBlock::getLastUnsizedArraySize(block,instanceNdx);
    }
    else {
      local_15c = glu::VarType::getArraySize((VarType *)&elemNdx);
    }
    local_54 = local_15c;
    for (local_58 = 0; uVar3 = curType.m_data._8_8_, local_58 < local_54; local_58 = local_58 + 1) {
      glu::SubTypeAccess::element(&local_88,accessPath,local_58);
      generateCompareSrc(src,resultVar,bufferLayout,block,instanceNdx,(BlockDataPtr *)uVar3,bufVar,
                         &local_88,LOAD_FULL_MATRIX);
      glu::SubTypeAccess::~SubTypeAccess(&local_88);
    }
  }
  else {
    bVar4 = glu::VarType::isStructType((VarType *)&elemNdx);
    if (bVar4) {
      this = glu::VarType::getStructPtr((VarType *)&elemNdx);
      iVar5 = glu::StructType::getNumMembers(this);
      for (local_9c = 0; uVar3 = curType.m_data._8_8_, local_9c < iVar5; local_9c = local_9c + 1) {
        glu::SubTypeAccess::member
                  ((SubTypeAccess *)((long)&apiName.field_2 + 8),accessPath,local_9c);
        generateCompareSrc(src,resultVar,bufferLayout,block,instanceNdx,(BlockDataPtr *)uVar3,bufVar
                           ,(SubTypeAccess *)((long)&apiName.field_2 + 8),LOAD_FULL_MATRIX);
        glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)((long)&apiName.field_2 + 8));
      }
    }
    else {
      pBVar6 = (BufferVar *)glu::SubTypeAccess::getPath(accessPath);
      ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)block,(BufferBlock *)bufVar,pBVar6,
                 pTVar7);
      iVar5 = BufferLayout::getVariableIndex(bufferLayout,(string *)local_f0);
      shaderName.field_2._8_8_ =
           std::
           vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
           ::operator[](&bufferLayout->bufferVars,(long)iVar5);
      pBVar6 = (BufferVar *)glu::SubTypeAccess::getPath(accessPath);
      ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
                ((string *)local_120,(_anonymous_namespace_ *)block,
                 (BufferBlock *)(ulong)(uint)instanceNdx,(int)bufVar,pBVar6,
                 (TypeComponentVector *)blockPtr);
      typeName._4_4_ = glu::VarType::getBasicType((VarType *)&elemNdx);
      typeName._3_1_ = glu::isDataTypeMatrix(typeName._4_4_);
      valuePtr = glu::getDataTypeName(typeName._4_4_);
      uVar3 = shaderName.field_2._8_8_;
      lVar2 = *(long *)curType.m_data._8_8_;
      pTVar7 = glu::SubTypeAccess::getPath(accessPath);
      iVar5 = computeOffset((BufferVarLayoutEntry *)uVar3,pTVar7);
      basicType_00 = typeName._4_4_;
      typeName_00 = valuePtr;
      valuePtr_00 = (void *)(lVar2 + iVar5);
      local_138 = valuePtr_00;
      if ((typeName._3_1_ & 1) == 0) {
        poVar8 = std::operator<<(src,"\t");
        poVar8 = std::operator<<(poVar8,resultVar);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,resultVar);
        poVar8 = std::operator<<(poVar8," && compare_");
        poVar8 = std::operator<<(poVar8,(char *)valuePtr);
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = std::operator<<(poVar8,(string *)local_120);
        std::operator<<(poVar8,", ");
        generateImmScalarVectorSrc(src,typeName._4_4_,local_138);
        std::operator<<(src,");\n");
      }
      else if (matrixLoadFlag == LOAD_MATRIX_COMPONENTS) {
        iVar5 = *(int *)(shaderName.field_2._8_8_ + 0x34);
        bVar1 = *(byte *)(shaderName.field_2._8_8_ + 0x40);
        std::__cxx11::string::string((string *)&local_158,(string *)local_120);
        generateImmMatrixSrc
                  (src,basicType_00,iVar5,(bool)(bVar1 & 1),valuePtr_00,resultVar,
                   (char *)typeName_00,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
      else {
        poVar8 = std::operator<<(src,"\t");
        poVar8 = std::operator<<(poVar8,resultVar);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,resultVar);
        poVar8 = std::operator<<(poVar8," && compare_");
        poVar8 = std::operator<<(poVar8,(char *)valuePtr);
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = std::operator<<(poVar8,(string *)local_120);
        std::operator<<(poVar8,", ");
        generateImmMatrixSrc
                  (src,typeName._4_4_,*(int *)(shaderName.field_2._8_8_ + 0x34),
                   (bool)(*(byte *)(shaderName.field_2._8_8_ + 0x40) & 1),local_138);
        std::operator<<(src,");\n");
      }
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  glu::VarType::~VarType((VarType *)&elemNdx);
  return;
}

Assistant:

void generateCompareSrc (
	std::ostream&				src,
	const char*					resultVar,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath,
	MatrixLoadFlags				matrixLoadFlag)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx), LOAD_FULL_MATRIX);
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx), LOAD_FULL_MATRIX);
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const char*					typeName		= glu::getDataTypeName(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());


			if (isMatrix)
			{
				if (matrixLoadFlag == LOAD_MATRIX_COMPONENTS)
					generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr, resultVar, typeName, shaderName);
				else
				{
					src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
					generateImmMatrixSrc (src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
					src << ");\n";
				}
			}
			else
			{
				src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
				generateImmScalarVectorSrc(src, basicType, valuePtr);
				src << ");\n";
			}
		}
	}
}